

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::DynamicMapField::AllocateMapValue
          (DynamicMapField *this,MapValueRef *map_val)

{
  MapValueRef *this_00;
  CppType CVar1;
  int iVar2;
  Reflection *this_01;
  FieldDescriptor *field;
  undefined8 *puVar3;
  undefined1 *val;
  string *this_02;
  undefined4 *puVar4;
  Message *pMVar5;
  undefined4 extraout_var;
  MessageFactory *factory;
  MapValueRef *in_RSI;
  Message *in_RDI;
  Message *value_9;
  Message *message;
  int32 *value_8;
  string *value_7;
  bool *value_6;
  float *value_5;
  double *value_4;
  uint64 *value_3;
  uint32 *value_2;
  int64 *value_1;
  int32 *value;
  FieldDescriptor *val_des;
  Message *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff30;
  Descriptor *in_stack_ffffffffffffff38;
  allocator local_39;
  string local_38 [32];
  FieldDescriptor *local_18;
  MapValueRef *local_10;
  
  local_10 = in_RSI;
  this_01 = (Reflection *)Message::GetDescriptor(in_stack_ffffffffffffff20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"value",&local_39);
  field = Descriptor::FindFieldByName(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  this_00 = local_10;
  local_18 = field;
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)0x6eb469);
  MapValueRef::SetType(this_00,CVar1);
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)0x6eb482);
  factory = (MessageFactory *)(ulong)(CVar1 - CPPTYPE_INT32);
  switch(factory) {
  case (MessageFactory *)0x0:
    puVar4 = (undefined4 *)operator_new(4);
    *puVar4 = 0;
    MapValueRef::SetValue(local_10,puVar4);
    break;
  case (MessageFactory *)0x1:
    puVar3 = (undefined8 *)operator_new(8);
    *puVar3 = 0;
    MapValueRef::SetValue(local_10,puVar3);
    break;
  case (MessageFactory *)0x2:
    puVar4 = (undefined4 *)operator_new(4);
    *puVar4 = 0;
    MapValueRef::SetValue(local_10,puVar4);
    break;
  case (MessageFactory *)0x3:
    puVar3 = (undefined8 *)operator_new(8);
    *puVar3 = 0;
    MapValueRef::SetValue(local_10,puVar3);
    break;
  case (MessageFactory *)0x4:
    puVar3 = (undefined8 *)operator_new(8);
    *puVar3 = 0;
    MapValueRef::SetValue(local_10,puVar3);
    break;
  case (MessageFactory *)0x5:
    puVar4 = (undefined4 *)operator_new(4);
    *puVar4 = 0;
    MapValueRef::SetValue(local_10,puVar4);
    break;
  case (MessageFactory *)0x6:
    val = (undefined1 *)operator_new(1);
    *val = 0;
    MapValueRef::SetValue(local_10,val);
    break;
  case (MessageFactory *)0x7:
    puVar4 = (undefined4 *)operator_new(4);
    *puVar4 = 0;
    MapValueRef::SetValue(local_10,puVar4);
    break;
  case (MessageFactory *)0x8:
    this_02 = (string *)operator_new(0x20);
    std::__cxx11::string::string(this_02);
    MapValueRef::SetValue(local_10,this_02);
    break;
  case (MessageFactory *)0x9:
    Message::GetReflection(in_stack_ffffffffffffff20);
    pMVar5 = Reflection::GetMessage(this_01,in_RDI,field,factory);
    iVar2 = (*(pMVar5->super_MessageLite)._vptr_MessageLite[3])();
    MapValueRef::SetValue(local_10,(void *)CONCAT44(extraout_var,iVar2));
  }
  return;
}

Assistant:

void DynamicMapField::AllocateMapValue(MapValueRef* map_val) {
  const FieldDescriptor* val_des =
      default_entry_->GetDescriptor()->FindFieldByName("value");
  map_val->SetType(val_des->cpp_type());
  // Allocate memory for the MapValueRef, and initialize to
  // default value.
  switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)           \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: { \
    TYPE* value = new TYPE();                \
    map_val->SetValue(value);                \
    break;                                   \
  }
    HANDLE_TYPE(INT32, int32);
    HANDLE_TYPE(INT64, int64);
    HANDLE_TYPE(UINT32, uint32);
    HANDLE_TYPE(UINT64, uint64);
    HANDLE_TYPE(DOUBLE, double);
    HANDLE_TYPE(FLOAT, float);
    HANDLE_TYPE(BOOL, bool);
    HANDLE_TYPE(STRING, std::string);
    HANDLE_TYPE(ENUM, int32);
#undef HANDLE_TYPE
    case FieldDescriptor::CPPTYPE_MESSAGE: {
      const Message& message =
          default_entry_->GetReflection()->GetMessage(*default_entry_, val_des);
      Message* value = message.New();
      map_val->SetValue(value);
      break;
    }
  }
}